

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O0

void __thiscall PolicyPureVector::SetDepth(PolicyPureVector *this,size_t d)

{
  PolicyDomainCategory PVar1;
  Interface_ProblemToPolicyDiscretePure *pIVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  PolicyDiscrete *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  PolicyDiscrete *__new_size;
  
  Policy::SetDepth(&in_RDI->super_Policy,(size_t)in_RSI);
  __new_size = in_RDI + 1;
  pIVar2 = PolicyDiscretePure::GetInterfacePTPDiscretePure
                     ((PolicyDiscretePure *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar3 = *(uint *)&in_RDI->field_0x34;
  PVar1 = PolicyDiscrete::GetPolicyDomainCategory(in_RDI);
  (*(pIVar2->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete[5])
            (pIVar2,(ulong)uVar3,(ulong)PVar1,in_RSI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(in_RSI,(size_type)__new_size);
  return;
}

Assistant:

void PolicyPureVector::SetDepth(size_t d)
{
    Policy::SetDepth(d);
    _m_domainToActionIndices.resize(
        GetInterfacePTPDiscretePure()->GetNrPolicyDomainElements(
            _m_agentI,
            GetPolicyDomainCategory(),
            d));
}